

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zher2.c
# Opt level: O3

int zher2_(char *uplo,integer *n,doublecomplex *alpha,doublecomplex *x,integer *incx,
          doublecomplex *y,integer *incy,doublecomplex *a,integer *lda)

{
  double *pdVar1;
  double dVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  doublecomplex *z;
  int iVar13;
  double dVar14;
  double *pdVar15;
  doublecomplex *pdVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  double dVar23;
  double dVar24;
  int local_ec;
  doublecomplex local_e8;
  doublecomplex local_d8;
  long local_c0;
  doublecomplex *local_b8;
  doublecomplex *local_b0;
  double local_a8;
  double dStack_a0;
  doublecomplex *local_98;
  uint *local_90;
  double local_88;
  double dStack_80;
  doublecomplex *local_70;
  integer *local_68;
  double dStack_60;
  double *local_58;
  double dStack_50;
  double *local_40;
  double *local_38;
  
  local_ec = 0;
  cVar3 = *uplo;
  if ((cVar3 == 'L') || (cVar3 == 'U')) {
    uVar4 = *n;
    uVar9 = (ulong)uVar4;
    if ((int)uVar4 < 0) {
      local_ec = 2;
    }
    else {
      iVar11 = *incx;
      if (iVar11 == 0) {
        local_ec = 5;
      }
      else {
        iVar7 = *incy;
        if (iVar7 == 0) {
          local_ec = 7;
        }
        else {
          iVar17 = *lda;
          if ((int)(uVar4 + (uVar4 == 0)) <= iVar17) {
            if (uVar4 == 0) {
              return 0;
            }
            if ((((alpha->r == 0.0) && (!NAN(alpha->r))) && (alpha->i == 0.0)) && (!NAN(alpha->i)))
            {
              return 0;
            }
            local_b8 = alpha;
            local_b0 = y;
            local_90 = (uint *)n;
            local_68 = incx;
            if (iVar11 == 1) {
              if (iVar7 == 1) {
                if (cVar3 == 'U') {
                  lVar21 = 0;
                  uVar20 = 1;
                  do {
                    local_c0 = uVar20 - 1;
                    pdVar16 = x + local_c0;
                    if ((((x[local_c0].r != 0.0) || (NAN(x[local_c0].r))) || (pdVar16->i != 0.0)) ||
                       (((NAN(pdVar16->i) || (y[local_c0].r != 0.0)) ||
                        ((NAN(y[local_c0].r) || ((y[local_c0].i != 0.0 || (NAN(y[local_c0].i))))))))
                       ) {
                      z = y + local_c0;
                      d_cnjg(&local_e8,z);
                      dVar24 = local_b8->r;
                      dVar14 = local_b8->i;
                      local_d8.r = local_e8.r * dVar24 + local_e8.i * -dVar14;
                      local_d8.i = local_e8.i * dVar24 + local_e8.r * dVar14;
                      local_e8.r = dVar24 * pdVar16->r + -dVar14 * pdVar16->i;
                      local_e8.i = dVar24 * pdVar16->i + dVar14 * pdVar16->r;
                      local_a8 = local_d8.r;
                      dStack_a0 = local_d8.i;
                      d_cnjg(&local_d8,&local_e8);
                      iVar17 = *lda;
                      if (1 < uVar20) {
                        lVar10 = 0;
                        do {
                          dVar24 = *(double *)((long)&x->r + lVar10);
                          dVar14 = *(double *)((long)&x->i + lVar10);
                          dVar23 = *(double *)((long)&local_b0->r + lVar10);
                          dVar2 = *(double *)((long)&local_b0->i + lVar10);
                          pdVar15 = (double *)((long)&a->r + lVar10 + iVar17 * lVar21);
                          dVar6 = pdVar15[1];
                          pdVar22 = (double *)((long)&a->r + lVar10 + iVar17 * lVar21);
                          *pdVar22 = dVar23 * local_d8.r + -dVar2 * local_d8.i +
                                     *pdVar15 + dVar24 * local_a8 + -dVar14 * dStack_a0;
                          pdVar22[1] = dVar23 * local_d8.i + dVar2 * local_d8.r +
                                       dVar6 + dVar24 * dStack_a0 + dVar14 * local_a8;
                          lVar10 = lVar10 + 0x10;
                        } while (lVar21 != lVar10);
                      }
                      local_e8.r = pdVar16->r * local_a8 + dStack_a0 * -pdVar16->i;
                      local_e8.i = pdVar16->r * dStack_a0 + local_a8 * pdVar16->i;
                      dVar24 = local_d8.r * z->i;
                      local_d8.r = z->r * local_d8.r + local_d8.i * -z->i + local_e8.r;
                      local_d8.i = z->r * local_d8.i + dVar24 + local_e8.i;
                      iVar11 = (int)local_c0 * (iVar17 + 1);
                      a[iVar11].r = local_d8.r + a[iVar11].r;
                      a[iVar11].i = 0.0;
                      uVar9 = (ulong)*local_90;
                      y = local_b0;
                    }
                    else {
                      a[(int)local_c0 * (iVar17 + 1)].i = 0.0;
                    }
                    lVar21 = lVar21 + 0x10;
                    bVar5 = (long)uVar20 < (long)(int)uVar9;
                    uVar20 = uVar20 + 1;
                  } while (bVar5);
                  return 0;
                }
                local_a8 = 7.90505033345994e-323;
                local_c0 = 0;
                lVar21 = 1;
                do {
                  lVar10 = lVar21 + -1;
                  pdVar16 = x + lVar10;
                  if (((((x[lVar10].r != 0.0) || (NAN(x[lVar10].r))) ||
                       ((pdVar16->i != 0.0 || ((NAN(pdVar16->i) || (y[lVar10].r != 0.0)))))) ||
                      (NAN(y[lVar10].r))) || ((y[lVar10].i != 0.0 || (NAN(y[lVar10].i))))) {
                    d_cnjg(&local_e8,y + lVar10);
                    dVar24 = local_b8->r;
                    dVar14 = local_b8->i;
                    local_d8.r = local_e8.r * dVar24 + local_e8.i * -dVar14;
                    local_d8.i = local_e8.i * dVar24 + local_e8.r * dVar14;
                    local_e8.r = dVar24 * pdVar16->r + -dVar14 * pdVar16->i;
                    local_e8.i = dVar24 * pdVar16->i + dVar14 * pdVar16->r;
                    local_68 = (integer *)local_d8.r;
                    dStack_60 = local_d8.i;
                    d_cnjg(&local_d8,&local_e8);
                    dVar24 = local_b0[lVar10].r;
                    dVar14 = local_b0[lVar10].i;
                    local_e8.r = (double)local_68 * pdVar16->r + -pdVar16->i * dStack_60;
                    local_e8.i = dStack_60 * pdVar16->r + pdVar16->i * (double)local_68;
                    dVar23 = local_d8.r * dVar24 + -dVar14 * local_d8.i + local_e8.r;
                    iVar17 = *lda;
                    iVar11 = (int)lVar10 * (iVar17 + 1);
                    a[iVar11].r = dVar23 + a[iVar11].r;
                    a[iVar11].i = 0.0;
                    uVar9 = (ulong)*local_90;
                    lVar10 = (long)(int)*local_90;
                    y = local_b0;
                    dVar24 = local_e8.i + local_d8.i * dVar24 + dVar14 * local_d8.r;
                    if (lVar21 < lVar10) {
                      dVar14 = local_a8;
                      do {
                        dVar24 = *(double *)((long)&x->r + (long)dVar14);
                        dVar23 = *(double *)((long)&x->i + (long)dVar14);
                        pdVar15 = (double *)((long)&a->r + (long)dVar14 + iVar17 * local_c0);
                        local_e8.r = *pdVar15 + dVar24 * (double)local_68 + dStack_60 * -dVar23;
                        local_e8.i = pdVar15[1] + dVar24 * dStack_60 + (double)local_68 * dVar23;
                        dVar24 = *(double *)((long)&local_b0->r + (long)dVar14);
                        dVar2 = *(double *)((long)&local_b0->i + (long)dVar14);
                        dVar23 = dVar24 * local_d8.r + local_d8.i * -dVar2 + local_e8.r;
                        dVar24 = dVar24 * local_d8.i + local_d8.r * dVar2 + local_e8.i;
                        pdVar15 = (double *)((long)&a->r + (long)dVar14 + iVar17 * local_c0);
                        *pdVar15 = dVar23;
                        pdVar15[1] = dVar24;
                        dVar14 = (double)((long)dVar14 + 0x10);
                      } while ((double)(uVar9 << 4) != dVar14);
                    }
                  }
                  else {
                    a[(int)lVar10 * (iVar17 + 1)].i = 0.0;
                    lVar10 = (long)(int)uVar9;
                    dVar23 = local_d8.r;
                    dVar24 = local_d8.i;
                  }
                  local_d8.i = dVar24;
                  local_d8.r = dVar23;
                  local_c0 = local_c0 + 0x10;
                  local_a8 = (double)((long)local_a8 + 0x10);
                  bVar5 = lVar21 < lVar10;
                  lVar21 = lVar21 + 1;
                } while (bVar5);
                return 0;
              }
              iVar8 = 1;
              iVar13 = 1 - (uVar4 - 1) * iVar7;
              if (0 < iVar7) {
                iVar13 = 1;
              }
            }
            else {
              iVar8 = 1 - iVar11 * (uVar4 - 1);
              if (0 < iVar11) {
                iVar8 = 1;
              }
              iVar13 = 1 - (uVar4 - 1) * iVar7;
              if (0 < iVar7) {
                iVar13 = 1;
              }
            }
            if (cVar3 == 'U') {
              local_98 = (doublecomplex *)&x[(long)iVar8 + -1].i;
              local_58 = &y[(long)iVar13 + -1].i;
              lVar21 = 0;
              uVar20 = 1;
              do {
                local_c0 = CONCAT44(local_c0._4_4_,iVar8);
                if (((((x[(long)iVar8 + -1].r != 0.0) || (NAN(x[(long)iVar8 + -1].r))) ||
                     (x[(long)iVar8 + -1].i != 0.0)) ||
                    ((NAN(x[(long)iVar8 + -1].i) || (y[(long)iVar13 + -1].r != 0.0)))) ||
                   ((NAN(y[(long)iVar13 + -1].r) ||
                    ((y[(long)iVar13 + -1].i != 0.0 || (NAN(y[(long)iVar13 + -1].i))))))) {
                  local_a8 = (double)CONCAT44(local_a8._4_4_,iVar13);
                  d_cnjg(&local_e8,y + (long)iVar13 + -1);
                  dVar24 = local_b8->r;
                  dVar14 = local_b8->i;
                  local_d8.r = local_e8.r * dVar24 + local_e8.i * -dVar14;
                  local_d8.i = local_e8.i * dVar24 + local_e8.r * dVar14;
                  local_e8.r = dVar24 * x[(long)iVar8 + -1].r + -dVar14 * x[(long)iVar8 + -1].i;
                  local_e8.i = dVar24 * x[(long)iVar8 + -1].i + dVar14 * x[(long)iVar8 + -1].r;
                  local_88 = local_d8.r;
                  dStack_80 = local_d8.i;
                  d_cnjg(&local_d8,&local_e8);
                  iVar17 = *lda;
                  iVar11 = *local_68;
                  iVar7 = *incy;
                  if (1 < uVar20) {
                    lVar10 = 0;
                    pdVar15 = local_58;
                    pdVar16 = local_98;
                    do {
                      dVar24 = ((doublecomplex *)((long)pdVar16 + -8))->r;
                      dVar14 = pdVar16->r;
                      dVar23 = ((doublecomplex *)(pdVar15 + -1))->r;
                      dVar2 = *pdVar15;
                      pdVar22 = (double *)((long)&a->r + lVar10 + iVar17 * lVar21);
                      dVar6 = pdVar22[1];
                      pdVar1 = (double *)((long)&a->r + lVar10 + iVar17 * lVar21);
                      *pdVar1 = dVar23 * local_d8.r + -dVar2 * local_d8.i +
                                *pdVar22 + dVar24 * local_88 + -dVar14 * dStack_80;
                      pdVar1[1] = dVar23 * local_d8.i + dVar2 * local_d8.r +
                                  dVar6 + dVar24 * dStack_80 + dVar14 * local_88;
                      lVar10 = lVar10 + 0x10;
                      pdVar16 = (doublecomplex *)((long)pdVar16 + (long)iVar11 * 2 * 8);
                      pdVar15 = pdVar15 + (long)iVar7 * 2;
                    } while (lVar21 != lVar10);
                  }
                  local_e8.r = x[(long)iVar8 + -1].r * local_88 + dStack_80 * -x[(long)iVar8 + -1].i
                  ;
                  local_e8.i = x[(long)iVar8 + -1].r * dStack_80 + local_88 * x[(long)iVar8 + -1].i;
                  dVar24 = local_d8.r * local_b0[(long)iVar13 + -1].i;
                  local_d8.r = local_b0[(long)iVar13 + -1].r * local_d8.r +
                               local_d8.i * -local_b0[(long)iVar13 + -1].i + local_e8.r;
                  local_d8.i = local_b0[(long)iVar13 + -1].r * local_d8.i + dVar24 + local_e8.i;
                  iVar8 = ((int)uVar20 + -1) * (iVar17 + 1);
                  a[iVar8].r = local_d8.r + a[iVar8].r;
                  a[iVar8].i = 0.0;
                  uVar9 = (ulong)*local_90;
                  y = local_b0;
                  iVar13 = local_a8._0_4_;
                }
                else {
                  a[((int)uVar20 + -1) * (iVar17 + 1)].i = 0.0;
                }
                iVar8 = (int)local_c0 + iVar11;
                iVar13 = iVar13 + iVar7;
                lVar21 = lVar21 + 0x10;
                bVar5 = (long)uVar20 < (long)(int)uVar9;
                uVar20 = uVar20 + 1;
              } while (bVar5);
              return 0;
            }
            local_38 = &x[-1].i;
            local_40 = &y[-1].i;
            uVar20 = 1;
            iVar12 = 0;
            local_98 = a;
            local_70 = x;
            do {
              local_98 = local_98 + 1;
              local_88 = (double)CONCAT44(local_88._4_4_,iVar12);
              local_c0 = CONCAT44(local_c0._4_4_,iVar8);
              lVar21 = (long)iVar8;
              lVar10 = (long)iVar13;
              iVar19 = (int)uVar20;
              if ((((x[lVar21 + -1].r != 0.0) || (NAN(x[lVar21 + -1].r))) ||
                  (x[lVar21 + -1].i != 0.0)) ||
                 (((NAN(x[lVar21 + -1].i) || (y[lVar10 + -1].r != 0.0)) ||
                  ((NAN(y[lVar10 + -1].r) || ((y[lVar10 + -1].i != 0.0 || (NAN(y[lVar10 + -1].i)))))
                  )))) {
                local_a8 = (double)CONCAT44(local_a8._4_4_,iVar13);
                d_cnjg(&local_e8,y + lVar10 + -1);
                dVar24 = local_b8->r;
                dVar14 = local_b8->i;
                local_d8.r = local_e8.r * dVar24 + local_e8.i * -dVar14;
                local_d8.i = local_e8.i * dVar24 + local_e8.r * dVar14;
                local_e8.r = dVar24 * x[lVar21 + -1].r + -dVar14 * x[lVar21 + -1].i;
                local_e8.i = dVar24 * x[lVar21 + -1].i + dVar14 * x[lVar21 + -1].r;
                local_58 = (double *)local_d8.r;
                dStack_50 = local_d8.i;
                d_cnjg(&local_d8,&local_e8);
                dVar24 = y[lVar10 + -1].r;
                dVar14 = y[lVar10 + -1].i;
                local_e8.r = (double)local_58 * x[lVar21 + -1].r + -x[lVar21 + -1].i * dStack_50;
                local_e8.i = dStack_50 * x[lVar21 + -1].r + x[lVar21 + -1].i * (double)local_58;
                dVar23 = local_d8.r * dVar24 + -dVar14 * local_d8.i + local_e8.r;
                iVar17 = *lda;
                iVar11 = (iVar17 + 1) * (iVar19 + -1);
                a[iVar11].r = dVar23 + a[iVar11].r;
                a[iVar11].i = 0.0;
                uVar9 = (ulong)*local_90;
                iVar11 = *local_68;
                iVar7 = *incy;
                y = local_b0;
                x = local_70;
                iVar12 = local_88._0_4_;
                iVar13 = local_a8._0_4_;
                dVar24 = local_e8.i + local_d8.i * dVar24 + dVar14 * local_d8.r;
                if (iVar19 < (int)*local_90) {
                  pdVar16 = local_98 + iVar17 * local_88._0_4_;
                  pdVar15 = local_38 + (lVar21 + iVar11) * 2;
                  pdVar22 = local_40 + (lVar10 + iVar7) * 2;
                  uVar18 = uVar9;
                  do {
                    local_e8.r = pdVar16->r +
                                 ((doublecomplex *)(pdVar15 + -1))->r * (double)local_58 +
                                 dStack_50 * -*pdVar15;
                    local_e8.i = pdVar16->i +
                                 ((doublecomplex *)(pdVar15 + -1))->r * dStack_50 +
                                 (double)local_58 * *pdVar15;
                    dVar23 = ((doublecomplex *)(pdVar22 + -1))->r * local_d8.r +
                             local_d8.i * -*pdVar22 + local_e8.r;
                    dVar24 = ((doublecomplex *)(pdVar22 + -1))->r * local_d8.i +
                             local_d8.r * *pdVar22 + local_e8.i;
                    pdVar16->r = dVar23;
                    pdVar16->i = dVar24;
                    pdVar16 = pdVar16 + 1;
                    uVar18 = uVar18 - 1;
                    pdVar15 = pdVar15 + (long)iVar11 * 2;
                    pdVar22 = pdVar22 + (long)iVar7 * 2;
                  } while (uVar20 != uVar18);
                }
              }
              else {
                a[(iVar17 + 1) * (iVar19 + -1)].i = 0.0;
                dVar23 = local_d8.r;
                dVar24 = local_d8.i;
              }
              local_d8.i = dVar24;
              local_d8.r = dVar23;
              iVar8 = (int)local_c0 + iVar11;
              iVar13 = iVar13 + iVar7;
              uVar20 = uVar20 + 1;
              iVar12 = iVar12 + 1;
            } while (iVar19 < (int)uVar9);
            return 0;
          }
          local_ec = 9;
        }
      }
    }
  }
  else {
    local_ec = 1;
  }
  input_error("ZHER2 ",&local_ec);
  return 0;
}

Assistant:

int zher2_(char *uplo, integer *n, doublecomplex *alpha, 
	doublecomplex *x, integer *incx, doublecomplex *y, integer *incy, 
	doublecomplex *a, integer *lda)
{


    /* System generated locals */

    doublereal d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp1, temp2;
    integer i, j;
    integer ix, iy, jx, jy, kx, ky;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZHER2  performs the hermitian rank 2 operation   

       A := alpha*x*conjg( y' ) + conjg( alpha )*y*conjg( x' ) + A,   

    where alpha is a scalar, x and y are n element vectors and A is an n 
  
    by n hermitian matrix.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the upper or lower   
             triangular part of the array A is to be referenced as   
             follows:   

                UPLO = 'U' or 'u'   Only the upper triangular part of A   
                                    is to be referenced.   

                UPLO = 'L' or 'l'   Only the lower triangular part of A   
                                    is to be referenced.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCY ) ).   
             Before entry, the incremented array Y must contain the n   
             element vector y.   
             Unchanged on exit.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular part of the hermitian matrix and the strictly   
             lower triangular part of A is not referenced. On exit, the   
             upper triangular part of the array A is overwritten by the   
             upper triangular part of the updated matrix.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular part of the hermitian matrix and the strictly   
             upper triangular part of A is not referenced. On exit, the   
             lower triangular part of the array A is overwritten by the   
             lower triangular part of the updated matrix.   
             Note that the imaginary parts of the diagonal elements need 
  
             not be set, they are assumed to be zero, and on exit they   
             are set to zero.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if (*n < 0) {
	info = 2;
    } else if (*incx == 0) {
	info = 5;
    } else if (*incy == 0) {
	info = 7;
    } else if (*lda < max(1,*n)) {
	info = 9;
    }
    if (info != 0) {
	input_error("ZHER2 ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || (alpha->r == 0. && alpha->i == 0.)) {
	return 0;
    }

/*     Set up the start points in X and Y if the increments are not both 
  
       unity. */

    if (*incx != 1 || *incy != 1) {
	if (*incx > 0) {
	    kx = 1;
	} else {
	    kx = 1 - (*n - 1) * *incx;
	}
	if (*incy > 0) {
	    ky = 1;
	} else {
	    ky = 1 - (*n - 1) * *incy;
	}
	jx = kx;
	jy = ky;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through the triangular part   
       of A. */

    if (strncmp(uplo, "U", 1)==0) {

/*        Form  A  when A is stored in the upper triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L10: */
		    }
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L20: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    ix = kx;
		    iy = ky;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
			ix += *incx;
			iy += *incy;
/* L30: */
		    }
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L40: */
	    }
	}
    } else {

/*        Form  A  when A is stored in the lower triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    for (i = j + 1; i <= *n; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L50: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    ix = jx;
		    iy = jy;
		    for (i = j + 1; i <= *n; ++i) {
			ix += *incx;
			iy += *incy;
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L70: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L80: */
	    }
	}
    }

    return 0;

/*     End of ZHER2 . */

}